

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void count_features(level *lev)

{
  char cVar1;
  char local_12;
  char local_11;
  int typ;
  xchar y;
  xchar x;
  level *lev_local;
  
  (lev->flags).nsinks = '\0';
  (lev->flags).nfountains = '\0';
  for (local_12 = '\0'; local_12 < '\x15'; local_12 = local_12 + '\x01') {
    for (local_11 = '\0'; local_11 < 'P'; local_11 = local_11 + '\x01') {
      cVar1 = lev->locations[local_11][local_12].typ;
      if (cVar1 == '\x1c') {
        (lev->flags).nfountains = (lev->flags).nfountains + '\x01';
      }
      else if (cVar1 == '\x1f') {
        (lev->flags).nsinks = (lev->flags).nsinks + '\x01';
      }
    }
  }
  return;
}

Assistant:

static void count_features(struct level *lev)
{
	xchar x, y;
	lev->flags.nfountains = lev->flags.nsinks = 0;
	for (y = 0; y < ROWNO; y++) {
	    for (x = 0; x < COLNO; x++) {
		int typ = lev->locations[x][y].typ;
		if (typ == FOUNTAIN)
		    lev->flags.nfountains++;
		else if (typ == SINK)
		    lev->flags.nsinks++;
	    }
	}
}